

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_lib_config(int nConfigOp,...)

{
  ProcMemError p_Var1;
  void *pvVar2;
  unqlite_vfs *pMethods;
  char in_AL;
  sxi32 sVar3;
  undefined8 in_RCX;
  uint uVar4;
  uint uVar5;
  undefined8 in_RDX;
  ProcMemError in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_d0 [16];
  unqlite_vfs *local_c0;
  void *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  pMethods = local_c0;
  pvVar2 = sUnqlMPGlobal.sAllocator.pUserData;
  p_Var1 = sUnqlMPGlobal.sAllocator.xMemError;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (sUnqlMPGlobal.nMagic == 0xea1495ba) {
    return -4;
  }
  sVar3 = 0;
  sUnqlMPGlobal.sAllocator.xMemError = p_Var1;
  sUnqlMPGlobal.sAllocator.pUserData = pvVar2;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  switch(nConfigOp) {
  case 1:
    if (local_c0 == (unqlite_vfs *)0x0) {
      sVar3 = 0;
      local_c0 = (unqlite_vfs *)in_RSI;
      local_b8 = (void *)in_RDX;
      memset(&sUnqlMPGlobal,0,0xb8);
      sUnqlMPGlobal.sAllocator.pMethods = &sOSAllocMethods;
      sUnqlMPGlobal.sAllocator.xMemError = p_Var1;
      sUnqlMPGlobal.sAllocator.pUserData = pvVar2;
    }
    else {
      local_c0 = (unqlite_vfs *)in_RSI;
      local_b8 = (void *)in_RDX;
      sVar3 = SyMemBackendInitFromOthers
                        (&sUnqlMPGlobal.sAllocator,(SyMemMethods *)pMethods,
                         sUnqlMPGlobal.sAllocator.xMemError,sUnqlMPGlobal.sAllocator.pUserData);
    }
    break;
  case 2:
    sUnqlMPGlobal.sAllocator.pUserData = local_b8;
    sUnqlMPGlobal.sAllocator.xMemError = in_RSI;
    uVar4 = sUnqlMPGlobal.iPageSize;
    goto LAB_0010ab13;
  case 3:
  case 4:
  case 5:
    break;
  case 6:
    sVar3 = 0;
    if (local_c0 != (unqlite_vfs *)0x0) {
      sUnqlMPGlobal.pVfs = local_c0;
    }
    break;
  case 7:
    sVar3 = -9;
    if ((((((local_c0 != (unqlite_vfs *)0x0) && (local_c0->zName != (char *)0x0)) &&
          (*local_c0->zName != '\0')) &&
         ((local_c0->xGetLastError != (_func_int_unqlite_vfs_ptr_int_char_ptr *)0x0 &&
          (local_c0[1].xCurrentTime != (_func_int_unqlite_vfs_ptr_Sytm_ptr *)0x0)))) &&
        ((local_c0[1].xTmpDir != (_func_int_unqlite_vfs_ptr_char_ptr_int *)0x0 &&
         ((local_c0[1].xSleep != (_func_int_unqlite_vfs_ptr_int *)0x0 &&
          (local_c0[1].xFullPathname != (_func_int_unqlite_vfs_ptr_char_ptr_int_char_ptr *)0x0))))))
       && (7 < local_c0->iVersion)) {
      local_c0 = (unqlite_vfs *)in_RSI;
      local_b8 = (void *)in_RDX;
      sVar3 = SySetPut(&sUnqlMPGlobal.kv_storage,local_d0);
    }
    break;
  case 8:
    if (0xfe00 < (uint)local_c0 - 0x200) {
      return -9;
    }
    uVar4 = (uint)local_c0 - ((uint)local_c0 >> 1 & 0x55555555);
    uVar5 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
    uVar4 = (uint)local_c0;
    if (1 < ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      return -9;
    }
LAB_0010ab13:
    sUnqlMPGlobal.iPageSize = uVar4;
    sVar3 = 0;
    break;
  default:
    sVar3 = -0x18;
  }
  return sVar3;
}

Assistant:

int unqlite_lib_config(int nConfigOp,...)
{
	va_list ap;
	int rc;
	if( sUnqlMPGlobal.nMagic == UNQLITE_LIB_MAGIC ){
		/* Library is already initialized, this operation is forbidden */
		return UNQLITE_LOCKED;
	}
	va_start(ap,nConfigOp);
	rc = unqliteCoreConfigure(nConfigOp,ap);
	va_end(ap);
	return rc;
}